

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void __thiscall
duckdb::AggregateExecutor::
UnaryScatter<duckdb::SumState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::HugeintSumOperation>
          (AggregateExecutor *this,Vector *input,Vector *states,AggregateInputData *aggr_input_data,
          idx_t count)

{
  undefined8 *puVar1;
  HugeintAdd *this_00;
  undefined1 *puVar2;
  hugeint_t *idata_00;
  SumState<duckdb::hugeint_t> **states_00;
  hugeint_t lhs;
  hugeint_t lhs_00;
  hugeint_t rhs;
  hugeint_t rhs_00;
  AggregateInputData *pAVar3;
  AggregateInputData *pAVar4;
  AggregateInputData *pAVar5;
  hugeint_t hVar6;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat sdata;
  data_ptr_t pdVar7;
  SelectionVector *in_stack_ffffffffffffff40;
  SelectionVector *pSVar8;
  data_ptr_t in_stack_ffffffffffffff48;
  unsigned_long *in_stack_ffffffffffffff50;
  unsigned_long *puVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  UnifiedVectorFormat local_78;
  
  if (*this == (AggregateExecutor)0x0) {
    if (input->vector_type == FLAT_VECTOR) {
      idata_00 = *(hugeint_t **)(this + 0x20);
      states_00 = (SumState<duckdb::hugeint_t> **)input->data;
      FlatVector::VerifyFlatVector((Vector *)this);
      UnaryFlatLoop<duckdb::SumState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::HugeintSumOperation>
                (idata_00,(AggregateInputData *)states,states_00,(ValidityMask *)(this + 0x28),
                 (idx_t)aggr_input_data);
      return;
    }
  }
  else if ((*this == (AggregateExecutor)0x2) && (input->vector_type == CONSTANT_VECTOR)) {
    if ((*(byte **)(this + 0x28) != (byte *)0x0) && ((**(byte **)(this + 0x28) & 1) == 0)) {
      return;
    }
    puVar1 = *(undefined8 **)(this + 0x20);
    this_00 = *(HugeintAdd **)input->data;
    *this_00 = (HugeintAdd)0x1;
    hVar6.upper = (int64_t)aggr_input_data;
    hVar6.lower = puVar1[1];
    HugeintAdd::AddConstant<duckdb::SumState<duckdb::hugeint_t>,duckdb::hugeint_t>
              (this_00,(SumState<duckdb::hugeint_t> *)*puVar1,hVar6,count);
    return;
  }
  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&stack0xffffffffffffff40);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat
            ((Vector *)this,(idx_t)aggr_input_data,(UnifiedVectorFormat *)&stack0xffffffffffffff40);
  Vector::ToUnifiedFormat(input,(idx_t)aggr_input_data,&local_78);
  if (in_stack_ffffffffffffff50 == (unsigned_long *)0x0) {
    if (aggr_input_data != (AggregateInputData *)0x0) {
      pAVar5 = (AggregateInputData *)0x0;
      puVar9 = (unsigned_long *)0x0;
      pdVar7 = local_78.data;
      do {
        pAVar3 = pAVar5;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          pAVar3 = (AggregateInputData *)(ulong)(local_78.sel)->sel_vector[(long)pAVar5];
        }
        puVar2 = *(undefined1 **)(pdVar7 + (long)pAVar3 * 8);
        *puVar2 = 1;
        lhs_00.upper = (int64_t)in_stack_ffffffffffffff40;
        lhs_00.lower = (uint64_t)pdVar7;
        rhs_00.upper = (int64_t)puVar9;
        rhs_00.lower = (uint64_t)in_stack_ffffffffffffff48;
        hVar6 = Hugeint::Add<true>(lhs_00,rhs_00);
        *(hugeint_t *)(puVar2 + 8) = hVar6;
        pAVar5 = (AggregateInputData *)((long)&(pAVar5->bind_data).ptr + 1);
      } while (aggr_input_data != pAVar5);
    }
  }
  else if (aggr_input_data != (AggregateInputData *)0x0) {
    pAVar5 = (AggregateInputData *)0x0;
    pdVar7 = local_78.data;
    pSVar8 = in_stack_ffffffffffffff40;
    do {
      pAVar3 = pAVar5;
      if (in_stack_ffffffffffffff40->sel_vector != (sel_t *)0x0) {
        pAVar3 = (AggregateInputData *)(ulong)in_stack_ffffffffffffff40->sel_vector[(long)pAVar5];
      }
      pAVar4 = pAVar5;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        pAVar4 = (AggregateInputData *)(ulong)(local_78.sel)->sel_vector[(long)pAVar5];
      }
      if ((in_stack_ffffffffffffff50 == (unsigned_long *)0x0) ||
         ((in_stack_ffffffffffffff50[(ulong)pAVar3 >> 6] >> ((ulong)pAVar3 & 0x3f) & 1) != 0)) {
        puVar2 = *(undefined1 **)(pdVar7 + (long)pAVar4 * 8);
        *puVar2 = 1;
        lhs.upper = (int64_t)pSVar8;
        lhs.lower = (uint64_t)pdVar7;
        rhs.upper = (int64_t)in_stack_ffffffffffffff50;
        rhs.lower = (uint64_t)in_stack_ffffffffffffff48;
        hVar6 = Hugeint::Add<true>(lhs,rhs);
        *(hugeint_t *)(puVar2 + 8) = hVar6;
      }
      pAVar5 = (AggregateInputData *)((long)&(pAVar5->bind_data).ptr + 1);
    } while (aggr_input_data != pAVar5);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
  }
  if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0._M_pi);
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}